

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O2

uchar * __thiscall vmrun_prop_eval::eval_prop_val(vmrun_prop_eval *this)

{
  vm_prop_id_t vVar1;
  uint uVar2;
  vm_obj_id_t vVar3;
  vm_datatype_t *pvVar4;
  vm_val_t *pvVar5;
  uint uVar6;
  int iVar7;
  uchar *puVar8;
  vm_val_t funcptr;
  
  pvVar5 = sp_;
  switch((this->val).typ) {
  case VM_DSTRING:
    if (this->argc == 0) {
      puVar8 = CVmRun::disp_dstring
                         (&G_interpreter_X,(this->val).val.ofs,this->caller_ofs,(this->self).val.obj
                         );
      return puVar8;
    }
    break;
  default:
    if (this->argc == 0) {
      r0_ = this->val;
      goto LAB_001ef124;
    }
    break;
  case VM_CODEOFS:
    vVar1 = this->target_prop;
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 5;
    *pvVar4 = VM_PROP;
    (pvVar5->val).prop = vVar1;
    vVar3 = (this->self).val.obj;
    pvVar5[1].typ = VM_OBJ;
    pvVar5[1].val.obj = vVar3;
    vVar3 = this->defining_obj;
    pvVar5[2].typ = VM_OBJ;
    pvVar5[2].val.obj = vVar3;
    vVar3 = (this->self).val.obj;
    pvVar5[3].typ = VM_OBJ;
    pvVar5[3].val.obj = vVar3;
    vVar3 = (this->val).val.obj;
    pvVar5[4].typ = VM_FUNCPTR;
    pvVar5[4].val.obj = vVar3;
    uVar2 = (this->val).val.obj;
    puVar8 = CVmRun::do_call(&G_interpreter_X,this->caller_ofs,
                             (uchar *)(G_code_pool_X.super_CVmPoolPaged.pages_
                                       [uVar2 >> ((byte)G_code_pool_X.super_CVmPoolPaged.
                                                        log2_page_size_ & 0x1f)].mem +
                                      (G_code_pool_X.super_CVmPoolPaged._8_4_ - 1 & uVar2)),
                             this->argc,(vm_rcdesc *)0x0);
    return puVar8;
  case VM_OBJX:
    uVar2 = (this->val).val.obj;
    uVar6 = uVar2 & 0xfff;
    iVar7 = (**(code **)(*(long *)&G_obj_table_X.pages_[uVar2 >> 0xc][uVar6].ptr_ + 0x70))
                      (G_obj_table_X.pages_[uVar2 >> 0xc] + uVar6,0);
    pvVar5 = sp_;
    if (iVar7 != 0) {
      funcptr.val.obj = (this->val).val.obj;
      funcptr.typ = VM_OBJ;
      vVar1 = this->target_prop;
      pvVar4 = &sp_->typ;
      sp_ = sp_ + 5;
      *pvVar4 = VM_PROP;
      (pvVar5->val).prop = vVar1;
      vVar3 = (this->self).val.obj;
      pvVar5[1].typ = VM_OBJ;
      pvVar5[1].val.obj = vVar3;
      vVar3 = this->defining_obj;
      pvVar5[2].typ = VM_OBJ;
      pvVar5[2].val.obj = vVar3;
      vVar3 = (this->self).val.obj;
      pvVar5[3].typ = VM_OBJ;
      pvVar5[3].val.obj = vVar3;
      vVar3 = (this->val).val.obj;
      pvVar5[4].typ = VM_OBJ;
      pvVar5[4].val.obj = vVar3;
      puVar8 = CVmRun::call_func_ptr_fr
                         (&G_interpreter_X,&funcptr,this->argc,(vm_rcdesc *)0x0,this->caller_ofs);
      return puVar8;
    }
    iVar7 = CVmObjString::is_string_obj((this->val).val.obj);
    pvVar5 = sp_;
    if (iVar7 == 0) {
      err_throw(0x89d);
    }
    vVar3 = (this->val).val.obj;
    pvVar4 = &sp_->typ;
    sp_ = sp_ + 1;
    *pvVar4 = VM_OBJ;
    (pvVar5->val).obj = vVar3;
    puVar8 = CVmRun::disp_string_val(&G_interpreter_X,this->caller_ofs,(this->self).val.obj);
    return puVar8;
  case VM_BIFPTRX:
    CVmRun::call_bif((CVmRun *)this,(uint)(this->val).val.prop,(uint)(this->val).val.bifptr.func_idx
                     ,this->argc);
LAB_001ef124:
    return entry_ptr_native_ + this->caller_ofs;
  }
  err_throw(0x899);
}

Assistant:

const uchar *eval_prop_val(VMG0_)
    {
        /* take appropriate action based on the datatype of the result */
        switch(val.typ)
        {
        case VM_CODEOFS:
            /* 
             *   It's a method - invoke the method.  This will set us up to
             *   start executing this new code, so there's nothing more we
             *   need to do here.  
             */
            
            /* push targetprop, targetobj, definingobj, self, and invokee */
            {
                vm_val_t *fp = G_stk->push(5);
                (fp++)->set_propid(target_prop);
                (fp++)->set_obj(self.val.obj);
                (fp++)->set_obj(defining_obj);
                (fp++)->set_obj(self.val.obj);
                (fp++)->set_fnptr(val.val.ofs);
            }
            
            /* call the function */
            return G_interpreter->do_call(
                vmg_ caller_ofs,
                (const uchar *)G_code_pool->get_ptr(val.val.ofs),
                argc, 0);

        default:
            /* for any other value, no arguments are allowed */
            if (argc != 0)
                err_throw(VMERR_WRONG_NUM_OF_ARGS);

            /* store the result in R0 */
            *G_interpreter->get_r0() = val;

            /* resume execution where we left off */
            return G_interpreter->get_entry_ptr() + caller_ofs;

        case VM_DSTRING:
            /* no arguments are allowed */
            if (argc != 0)
                err_throw(VMERR_WRONG_NUM_OF_ARGS);
            
            /* 
             *   it's a self-printing string - invoke the default string
             *   output function (this is effectively a do_call()) 
             */
            return G_interpreter->disp_dstring(
                vmg_ val.val.ofs, caller_ofs, self.val.obj);
            
        case VM_OBJX:
            /* 
             *   Execute-on-eval object.  If the value is an anonymous
             *   function or other invokable object, call it.  If it's a
             *   string, print it.  
             */
            if (vm_objp(vmg_ val.val.obj)->get_invoker(vmg_ 0))
            {
                /* convert to an ordinary anonymous function object */
                vm_val_t funcptr;
                funcptr.set_obj(val.val.obj);
                
                /* prepare the invocation frame */
                vm_val_t *fp = G_stk->push(5);
                (fp++)->set_propid(target_prop);
                (fp++)->set_obj(self.val.obj);
                (fp++)->set_obj(defining_obj);
                (fp++)->set_obj(self.val.obj);
                (fp++)->set_obj(val.val.obj);

                /* invoke the function */
                return G_interpreter->call_func_ptr_fr(
                    vmg_ &funcptr, argc, 0, caller_ofs);
            }
            else if (CVmObjString::is_string_obj(vmg_ val.val.obj))
            {
                /* print the string */
                G_interpreter->push_obj(vmg_ val.val.obj);
                return G_interpreter->disp_string_val(
                    vmg_ caller_ofs, self.val.obj);
            }
            err_throw(VMERR_BAD_TYPE_CALL);
            
        case VM_BIFPTRX:
            /* Execute-on-eval built-in function.  Call the function. */
            G_interpreter->call_bif(
                vmg_ val.val.bifptr.set_idx, val.val.bifptr.func_idx, argc);
            
            /* resume execution where we left off */
            return G_interpreter->get_entry_ptr() + caller_ofs;
        }
    }
};

/* ------------------------------------------------------------------------ */
/*
 *   Integer arithmetic with promotions to BigNumber on overflow
 */

#define VMRUN_PROMOTE_INTS_ON_OVERFLOW
#ifdef VMRUN_PROMOTE_INTS_ON_OVERFLOW

static void promote_int_add(VMG_ vm_val_t *aval, int32_t b)
{
    bignum_t<10> sum((long)aval->val.intval);
    sum += (long)b;
    aval->set_obj(CVmObjBigNum::create(vmg_ FALSE, sum));
}

static inline void int_add(VMG_ vm_val_t *aval, int32_t b)
{
    int32_t a = aval->val.intval, sum = a + b;
    if (a >= 0 ? b <= 0 || sum >= a : b >= 0 || sum <= a)
        aval->val.intval = sum;
    else
        promote_int_add(vmg_ aval, b);
}

static void promote_int_sub(VMG_ vm_val_t *aval, int32_t b)
{
    bignum_t<10> diff((long)aval->val.intval);
    diff -= (long)b;
    aval->set_obj(CVmObjBigNum::create(vmg_ FALSE, diff));
}

static inline void int_sub(VMG_ vm_val_t *aval, int32_t b)
{
    int32_t a = aval->val.intval, diff = a - b;
    if (a >= 0 ? b >= 0 || diff >= a : b < 0 || diff <= a)
        aval->val.intval = diff;
    else
        promote_int_sub(vmg_ aval, b);
}

static void promote_int_mul(VMG_ vm_val_t *aval, int32_t b)
{
    bignum_t<20> prod((long)aval->val.intval);
    prod *= (long)b;
    aval->set_obj(CVmObjBigNum::create(vmg_ FALSE, prod));
}

static inline void int_mul(VMG_ vm_val_t *aval, int32_t b)
{
    int64_t a = aval->val.intval, prod = a * b;
    if (prod <= (int64_t)INT32MAXVAL && prod >= (int64_t)INT32MINVAL)
        aval->val.intval = (int32_t)prod;
    else
        promote_int_mul(vmg_ aval, b);
}

static void promote_int_div(VMG_ vm_val_t *aval, int32_t b)
{
    bignum_t<10> quo((long)aval->val.intval);
    quo /= (long)b;
    aval->set_obj(CVmObjBigNum::create(vmg_ FALSE, quo));
}

static inline void int_div(VMG_ vm_val_t *aval, int32_t b)
{
    /* check for division by zero */
    if (b == 0)
        err_throw(VMERR_DIVIDE_BY_ZERO);

    /* 
     *   NB - assuming 2's complement notation; the only integer division
     *   that can result in overflow is INT32MINVAL/-1 
     */
    int32_t a = aval->val.intval;
    if (a != INT32MINVAL || b != -1)
        aval->val.intval = a / b;
    else
        promote_int_div(vmg_ aval, b);
}

static void promote_int_neg(VMG_ vm_val_t *aval)
{
    bignum_t<10> neg((long)aval->val.intval);
    neg = -neg;
    aval->set_obj(CVmObjBigNum::create(vmg_ FALSE, neg));
}

static inline void int_neg(VMG_ vm_val_t *aval)
{
    /* 
     *   NB - assuming 2's complement representation; the only integer
     *   negation that can result in overflow is -INT32MINVAL 
     */
    if (aval->val.intval != INT32MINVAL)
        aval->val.intval = -aval->val.intval;
    else
        promote_int_neg(vmg_ aval);
}

#define INT_ADD(aval, b) int_add(vmg_ aval, b)
#define INT_SUB(aval, b) int_sub(vmg_ aval, b)
#define INT_MUL(aval, b) int_mul(vmg_ aval, b)
#define INT_DIV(aval, b) int_div(vmg_ aval, b)
#define INT_NEG(aval) int_neg(vmg_ aval)

#else

#define INT_ADD(aval, b) ((aval)->val.intval += (b))
#define INT_SUB(aval, b) ((aval)->val.intval -= (b))
#define INT_MUL(aval, b) ((aval)->val.intval *= (b))
#define INT_DIV(aval, b) \
    if (b == 0) err_throw(VMERR_DIVIDE_BY_ZERO); \
    else ((aval)->val.intval /= (b))
#define INT_NEG(aval) ((aval)->val.intval = -(aval)->val.intval)

#endif


/* ------------------------------------------------------------------------ */
/*
 *   Calculations for conditionals 
 */
#if 1
/* 
 *   Faster versions.  All of the type checks in these are inline.  These
 *   yield equivalent results to the more abstracted versions, but since they
 *   check for an explicit set of types, these won't automatically adapt if
 *   new primitive types are added to the VM in the future.  These tests are
 *   done so frequently in typical bytecode execution that they're critical
 *   for performance, so the loss of abstractness from the micro-optimization
 *   is worthwhile for speed.
 */
# define false_for_cond(v) \
    ((v)->typ == VM_NIL || ((v)->typ == VM_INT && (v)->val.intval == 0))
# define true_for_cond(v) \
    ((v)->typ == VM_TRUE \
     || (v)->typ == VM_ENUM \
	 || ((v)->typ == VM_INT && (!(v)->val.intval) == 0))
# define is_valid_for_jst(v) \
    ((v)->typ == VM_NIL || (v)->typ == VM_INT)

#else
/* 
 *   Abstracted versions.  These yield the same results as the faster
 *   versions above.  These versions use abstract type tests that should in
 *   principle adapt automatically if new primitive numeric types are added
 *   in future VM versions.  But the virtual method calls add runtime
 *   overhead vs the faster inline versions.
 */
# define false_for_cond(v) \
    ((v)->typ == VM_NIL \
     || ((v)->is_numeric(vmg0_) && (v)->num_is_zero(vmg0_)))
# define true_for_cond(v) \
    ((v)->typ == VM_TRUE \
     || (v)->typ == VM_ENUM \
     || ((v)->is_numeric(vmg0_) && !(v)->num_is_zero(vmg0_)))
# define is_valid_for_jst(v) \
    ((v)->typ == VM_NIL || (v)->is_numeric(vmg0_))

#endif


/* ------------------------------------------------------------------------ */
/*
 *   Execute byte code 
 */
void CVmRun::run(VMG_ const uchar *start_pc)
{
    /* 
     *   If you're concerned about a compiler warning on the following
     *   'register' declaration, refer to the footnote at the bottom of this
     *   file (search for [REGISTER_P_FOOTNOTE]).  Executive summary: you can
     *   safely ignore the warning, and I'm keeping the code as it is because
     *   it causes better optimization on some platforms, and is harmless
     *   when it doesn't help with optimization.  
     */
    REGISTER const uchar *p = start_pc;
    vmrun_prop_eval propev;
    vm_val_t *valp;
    vm_val_t *valp2;
    vm_val_t val;
    vm_val_t val2;
    vm_val_t val3;
    int done;
    vm_obj_id_t obj;
    vm_prop_id_t prop;
    uint argc;
    vm_obj_id_t unhandled_exc;
    const uchar *last_pc = start_pc;
    const uchar **old_pc_ptr;

    /* save the enclosing program counter pointer, and remember the new one */
    old_pc_ptr = pc_ptr_;
    pc_ptr_ = &last_pc;

    /* we're not done yet */
    done = FALSE;

    /* no unhandled exception yet */
    unhandled_exc = VM_INVALID_OBJ;

    /*
     *   Come back here whenever we catch a run-time exception and find a
     *   byte-code error handler to process it in the stack.  We'll
     *   re-enter our exception handler and resume byte-code execution at
     *   the handler.  
     */
resume_execution:

    /*
     *   Execute all code within an exception frame.  If any routine we
     *   call throws an exception, we'll catch the exception and process
     *   it as a run-time error.  
     */
    err_try
    {
        /* execute code until something makes us stop */
        for (;;)
        {
#ifdef VM_DEBUGGER
            /* 
             *   check for user-requested break, and step into the debugger
             *   if we find it 
             */
            static int brkchk = 0;
            if (++brkchk > 10000)
            {
                /* reset the break counter */
                brkchk = 0;
                
                /* check for break, and step into debugger if found */
                if (os_break())
                {
                    if (G_debugger->is_in_debugger())
                        err_throw(VMERR_DBG_INTERRUPT);
                    else
                        G_debugger->set_break_stop();
                }                            
            }

            /* if we're single-stepping, break into the debugger */
            if (G_debugger->is_single_step())
                G_debugger->step(vmg_ &p, entry_ptr_native_, FALSE, 0);
            
            /* check for a halt request from the debugger */
            if (halt_vm_)
                err_throw(VMERR_DBG_HALT);

        exec_instruction:

#endif /* VM_DEBUGGER */

            /* 
             *   Remember the location of this instruction in a non-register
             *   variable, in case there's an exception.  (We know that
             *   last_pc is guaranteed to be a non-register variable because
             *   we take its address and store it in our pc_ptr_ member.)
             *   
             *   We need to know the location of the last instruction when
             *   an exception occurs so that we can find the exception
             *   handler.  We want to encourage the compiler to enregister
             *   'p', since we access it so frequently in this routine; but
             *   if it's in a register, there's a risk we'd get the
             *   setjmp-time value in our exception handler.  To handle both
             *   needs, simply copy the value to our non-register variable
             *   last_pc; this will still let the vast majority of our
             *   access to 'p' use fast register operations if the compiler
             *   allows this, while ensuring we have a safe copy around in
             *   case of exceptions.  
             */
            last_pc = p;

            /* 
             *   Execute the current instruction.
             *   
             *   The order of the case table is in descending order of
             *   frequency of instruction usage for the first 30 or so
             *   instructions, according to empirical testing.  This is
             *   intended to keep the code for the most common instructions
             *   within a short jump of the 'switch', to increase the chances
             *   that an instruction jump will go to a location in cache.
             *   This seems to yield a slight speed improvement on Intel
             *   machines, and even if it doesn't help on a given machine, it
             *   shouldn't do any harm relative to a randomly ordered case
             *   table.  
             */
            switch(*p++)
            {
            case OPC_GETARGN0:
                push(get_param(vmg_ 0));
                continue;

            case OPC_GETPROPSELF:
                /* evaluate the property of 'self' */
                prop = get_op_uint16(&p);
                p = propev.get_prop(
                    vmg_ p - entry_ptr_native_, get_self(vmg0_), prop);
                continue;

            case OPC_GETR0:
                /* push the contents of R0 */
                push(&r0_);
                continue;

            case OPC_DUPR0:
                /* push the contents of R0 twice */
                push(&r0_);
                push(&r0_);
                continue;

            case OPC_GETSETLCL1R0:
                /* set local from R0 and leave value on stack */
                push(&r0_);
                *get_local(vmg_ get_op_uint8(&p)) = r0_;
                continue;

            case OPC_GETSETLCL1:
                /* set local and leave value on stack */
                *get_local(vmg_ get_op_uint8(&p)) = *get(0);
                continue;

            case OPC_SETPROPSELF:
                /* get the value to set */
                pop(&val);

                /* set it */
                set_prop(vmg_ get_self(vmg0_), get_op_uint16(&p), &val);
                continue;

            case OPC_SETLCL1R0:
                /* store R0 in the specific local */
                *get_local(vmg_ get_op_uint8(&p)) = r0_;
                continue;

            case OPC_GETARGN1:
                push(get_param(vmg_ 1));
                continue;

            case OPC_GETLCLN0:
                push(get_local(vmg_ 0));
                continue;

            case OPC_SETLCL1:
                /* get a pointer to the local */
                valp = get_local(vmg_ get_op_uint8(&p));

                /* pop the value into the local */
                pop(valp);
                continue;

            case OPC_PUSHSELF:
                /* push 'self' */
                push(get_self_val(vmg0_));
                continue;

            case OPC_RETNIL:
                /* store nil in R0 */
                r0_.set_nil();

                /* return */
                if ((p = do_return(vmg0_)) == 0)
                    goto exit_loop;
                continue;

            case OPC_RETVAL:
                /* pop the return value into R0 */
                pop(&r0_);

                /* return */
                if ((p = do_return(vmg0_)) == 0)
                    goto exit_loop;
                continue;

            case OPC_GETPROPLCL1:
                /* get the local whose property we're evaluating */
                propev.self = *get_local(vmg_ get_op_uint8(&p));

                /* evaluate the property of the local variable */
                prop = get_op_uint16(&p);
                p = propev.get_prop(vmg_ p - entry_ptr_native_, prop);
                continue;

            case OPC_JNIL:
                /* jump if top of stack is nil */
                valp = get(0);
                p += (valp->typ == VM_NIL ? osrp2s(p) : 2);

                /* discard the top value, regardless of what happened */
                discard();
                continue;

            case OPC_RET:
                /* return, leaving R0 unchanged */
                if ((p = do_return(vmg0_)) == 0)
                    goto exit_loop;
                continue;

            case OPC_PUSHENUM:
                /* push a UINT4 operand value */
                push()->set_enum(get_op_uint32(&p));
                continue;

            case OPC_JMP:
                /* unconditionally jump to the given offset */
                p += osrp2s(p);
                continue;

            case OPC_JNE:
                /* jump if the two values at top of stack are not equal */
                p += (!pop2_equal(vmg0_) ? osrp2s(p) : 2);
                continue;

            case OPC_JR0F:
                /* 
                 *   if R0 is true, or it's a non-zero numeric value, or any
                 *   non-numeric and non-boolean value, stay put; otherwise,
                 *   jump 
                 */
                if (false_for_cond(&r0_))
                {
                    /* it's zero or nil - jump */
                    p += osrp2s(p);
                }
                else
                {
                    /* it's non-zero and non-nil - do not jump */
                    p += 2;
                }
                continue;

            case OPC_GETARGN2:
                push(get_param(vmg_ 2));
                continue;

            case OPC_JGT:
                /* jump if greater */
                p += (pop2_compare_gt(vmg0_) ? osrp2s(p) : 2);
                continue;

            case OPC_CALLPROPSELF:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_callpropself:
                /* evaluate the property of 'self' */
                propev.self.set_obj(get_self(vmg0_));
                prop = get_op_uint16(&p);
                p = propev.get_prop(vmg_ p - entry_ptr_native_, prop, argc);
                continue;

            case OPC_INDEX:
                /* index TOS-1 by TOS, storing the result at TOS-1 */
                valp = get(1);
                if (apply_index(vmg_ valp, valp, get(0)))
                {
                    /* discard the index value */
                    discard();
                }
                else
                {
                    /* try an operator overload */
                    pop_left_op(vmg_ &val);
                    p = op_overload(vmg_ p - entry_ptr_native_, -1,
                                    &val, G_predef->operator_idx, 1,
                                    VMERR_CANNOT_INDEX_TYPE);
                }
                continue;

            case OPC_DUP:
                /* re-push the item at top of stack */
                push(get(0));
                continue;

            case OPC_IDXLCL1INT8:
                /* get the local */
                valp = get_local(vmg_ get_op_uint8(&p));

                /* get the index value */
                val2.set_int(get_op_uint8(&p));

                /* 
                 *   look up the indexed value of the local, storing the
                 *   result in a newly-pushed stack element 
                 */
                if (!apply_index(vmg_ push(), valp, &val2))
                {
                    /* 
                     *   try an operator overload - push the index value as
                     *   the argument 
                     */
                    push(&val2);
                    p = op_overload(vmg_ p - entry_ptr_native_, -1,
                                    valp, G_predef->operator_idx, 1,
                                    VMERR_CANNOT_INDEX_TYPE);
                }
                continue;

            case OPC_GETLCLN2:
                push(get_local(vmg_ 2));
                continue;

            case OPC_CALLPROP:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_callprop:
                /* pop the object whose property we're fetching */
                pop(&propev.self);

                /* evaluate the property given by the immediate data */
                prop = get_op_uint16(&p);
                p = propev.get_prop(vmg_ p - entry_ptr_native_, prop, argc);
                continue;

            case OPC_GETLCLN1:
                push(get_local(vmg_ 1));
                continue;

            case OPC_GETARGN3:
                push(get_param(vmg_ 3));
                continue;

            case OPC_GETLCLN3:
                push(get_local(vmg_ 3));
                continue;

            case OPC_JNOTNIL:
                /* jump if top of stack is not nil */
                valp = get(0);
                p += (valp->typ != VM_NIL ? osrp2s(p) : 2);

                /* discard the top value, regardless of what happened */
                discard();
                continue;

            case OPC_ITERNEXT:
                /* get the iterator object from the local */
                valp = get_local(vmg_ get_op_uint16(&p));

                /* get the next value from the iterator */
                if (valp->typ == VM_OBJ
                    && vm_objp(vmg_ valp->val.obj)->iter_next(
                        vmg_ valp->val.obj, &val))
                {
                    /* another value is available - push it and proceed */
                    push(&val);
                    p += 2;
                }
                else
                {
                    /* no more values available - exit the loop */
                    p += osrp2s(p);
                }
                break;

            case OPC_PUSH_0:
                /* push the constant value 0 */
                push()->set_int(0);
                continue;

            case OPC_GETPROP:
                /* get the object whose property we're fetching */
                pop(&propev.self);

                /* evaluate the property */
                prop = get_op_uint16(&p);
                p = propev.get_prop(vmg_ p - entry_ptr_native_, prop);
                continue;

            case OPC_GETLCLN4:
                push(get_local(vmg_ 4));
                continue;

            case OPC_JE:
                /* jump if the two values at top of stack are equal */
                p += (pop2_equal(vmg0_) ? osrp2s(p) : 2);
                continue;

                /* 
                 *   End of case table sorting by instruction execution
                 *   frequency.  The order of the remainder is more or less
                 *   arbitrary; we get diminishing returns from the frequency
                 *   ordering past a certain point, because CPU caches are
                 *   only so large.  
                 */

            case OPC_PUSHNIL:
                /* push nil */
                push()->set_nil();
                continue;

            case OPC_PUSHTRUE:
                /* push true */
                push()->set_true();
                continue;

            case OPC_PUSH_1:
                /* push the constant value 1 */
                push()->set_int(1);
                continue;

            case OPC_PUSHINT8:
                /* push an SBYTE operand value */
                push()->set_int(get_op_int8(&p));
                continue;

            case OPC_PUSHINT:
                /* push a UINT4 operand value */
                push()->set_int(get_op_int32(&p));
                continue;

            case OPC_INC:
                /* 
                 *   Increment the value at top of stack.  We must perform
                 *   the same type conversions as the ADD instruction does.
                 *   As an optimization, check to see if we have an integer
                 *   on top of the stack, and if so simply increment its
                 *   value without popping and repushing.  
                 */
                if ((valp = get(0))->typ == VM_INT)
                {
                    /* it's an integer - increment it, and we're done */
                    ++(valp->val.intval);
                }
                else
                {
                    /* for other types, use the general handler */
                    p = compute_sum_inc(vmg_ p);
                }
                continue;

            case OPC_ADD:
                /* if they're both integers, add them the quick way */
                valp = get(0);
                valp2 = get(1);
                if (valp->typ == VM_INT && valp2->typ == VM_INT)
                {
                    /* compute the sum */
                    INT_ADD(valp2, valp->val.intval);

                    /* discard the second value */
                    discard();
                }
                else
                {
                    /* for other types, use the general handler */
                    p = compute_sum_add(vmg_ p);
                }
                continue;

            case OPC_DEC:
                /* 
                 *   Decrement the value at top of stack.  We must perform
                 *   the same type conversions as the SUB instruction does.
                 *   As an optimization, check to see if we have an integer
                 *   on top of the stack, and if so simply decrement its
                 *   value without popping and repushing.  
                 */
                if ((valp = get(0))->typ == VM_INT)
                {
                    /* it's an integer - decrement it, and we're done */
                    INT_SUB(valp, 1);
                }
                else
                {
                    /* for other types, use the general handler */
                    p = compute_diff_dec(vmg_ p);
                }
                continue;

            case OPC_SUB:
                /* if they're both integers, subtract them the quick way */
                valp = get(0);
                valp2 = get(1);
                if (valp->typ == VM_INT && valp2->typ == VM_INT)
                {
                    /* compute the difference */
                    INT_SUB(valp2, valp->val.intval);

                    /* discard the second value */
                    discard();
                }
                else
                {
                    /* for other types, use the general handler */
                    p = compute_diff_sub(vmg_ p);
                }
                continue;

            case OPC_PUSHSTR:
                /* push UINT4 offset operand as a string */
                push()->set_sstring(get_op_uint32(&p));
                continue;

            case OPC_DISC:
                /* discard the item at the top of the stack */
                discard();
                continue;

            case OPC_DISC1:
                /* discard n items */
                discard(get_op_uint8(&p));
                continue;

            case OPC_PUSHLST:
                /* push UINT4 offset operand as a list */
                push()->set_list(get_op_uint32(&p));
                continue;

            case OPC_PUSHOBJ:
                /* push UINT4 object ID operand */
                push()->set_obj(get_op_uint32(&p));
                continue;
                
            case OPC_PUSHPROPID:
                /* push UINT2 property ID operand */
                push()->set_propid(get_op_uint16(&p));
                continue;

            case OPC_PUSHFNPTR:
                /* push a function pointer operand */
                push()->set_fnptr(get_op_uint32(&p));
                continue;

            case OPC_PUSHPARLST:
                {
                    /* get the number of fixed parameters */
                    uint cnt = *p++;

                    /* allocate the list from the parameters */
                    obj = CVmObjList::create_from_params(
                        vmg_ cnt, get_cur_argc(vmg0_) - cnt);
                    
                    /* push the new list */
                    push()->set_obj(obj);
                }
                continue;

            case OPC_MAKELSTPAR:
                makelstpar(vmg0_);
                continue;

            case OPC_NEG:
                /* if it's an integer value, do the calculation inline */
                if ((valp = get(0))->typ == VM_INT)
                {
                    /* negate number in place */
                    INT_NEG(valp);
                }
                else if (valp->typ == VM_OBJ
                         && vm_objp(vmg_ valp->val.obj)->neg_val(
                             vmg_ &val2, valp->val.obj))
                {
                    /* the object defined it natively - store the result */
                    *valp = val2;
                }
                else
                {
                    /* try the overloaded operator */
                    pop(&val);
                    p = op_overload(vmg_ p - entry_ptr_native_, -1,
                                    &val, G_predef->operator_neg, 0,
                                    VMERR_BAD_TYPE_NEG);
                }
                continue;

            case OPC_BNOT:
                /* check the type */
                if ((valp = get(0))->typ == VM_INT)
                {
                    /* bitwise NOT the integer on top of stack */
                    valp->val.intval = ~valp->val.intval;
                }
                else
                {
                    /* try the overloaded operator */
                    pop(&val);
                    p = op_overload(vmg_ p - entry_ptr_native_, -1,
                                    &val, G_predef->operator_bit_not, 0,
                                    VMERR_BAD_TYPE_BIT_NOT);
                }
                continue;

            case OPC_MUL:
                /* if they're both integers, this is easy */
                valp = get(0);
                valp2 = get(1);
                if (valp->typ == VM_INT && valp2->typ == VM_INT)
                {
                    /* compute the product */
                    INT_MUL(valp2, valp->val.intval);

                    /* discard the second value */
                    discard();
                }
                else if (compute_product(vmg_ valp2, valp))
                {
                    /* success - discard the second value */
                    discard();
                }
                else
                {
                    /* try for an operator overload */
                    pop_left_op(vmg_ &val);
                    p = op_overload(vmg_ p - entry_ptr_native_, -1,
                                    &val, G_predef->operator_mul, 1,
                                    VMERR_BAD_TYPE_MUL);
                }
                continue;

            case OPC_DIV:
                /* if they're both integers, do the division inline */
                valp = get(0);
                valp2 = get(1);
                if (valp->typ == VM_INT && valp2->typ == VM_INT)
                {
                    /* compute the result of the division */
                    INT_DIV(valp2, valp->val.intval);

                    /* discard the second value */
                    discard();
                }
                else if (compute_quotient(vmg_ valp2, valp))
                {
                    /* success - discard the second operand */
                    discard();
                }
                else
                {
                    /* try for an operator overload */
                    pop_left_op(vmg_ &val);
                    p = op_overload(vmg_ p - entry_ptr_native_, -1,
                                    &val, G_predef->operator_div, 1,
                                    VMERR_BAD_TYPE_DIV);
                }
                continue;

            case OPC_MOD:
                /* remainder number at (TOS-1) by number at top of stack */
                valp = get(0);
                valp2 = get(1);

                /* if they're both integers, do a quick local operation */
                if (valp->typ == VM_INT && valp2->typ == VM_INT)
                {
                    /* check for division by zero */
                    if (valp->val.intval == 0)
                        err_throw(VMERR_DIVIDE_BY_ZERO);

                    /* 
                     *   compute the remainder (TOS-1) % (TOS), leaving the
                     *   result at (TOS-1), and discard the second operand 
                     */
                    valp2->val.intval = os_remainder_long(
                        valp2->val.intval, valp->val.intval);

                    /* discard the second value */
                    discard();
                }
                else
                {
                    /* try for an operator overload */
                    pop_left_op(vmg_ &val);
                    p = op_overload(vmg_ p - entry_ptr_native_, -1,
                                    &val, G_predef->operator_mod, 1,
                                    VMERR_BAD_TYPE_MOD);
                }
                continue;

            case OPC_BAND:
                /* bitwise AND two integers on top of stack */
                valp = get(0);
                valp2 = get(1);

                /* if we have two integers, do it the quick way */
                if (valp->typ == VM_INT && valp2->typ == VM_INT)
                {
                    /* compute the result and discard the second operand */
                    valp2->val.intval &= valp->val.intval;

                    /* discard the second value */
                    discard();
                }
                else
                {
                    /* try for an operator overload */
                    pop_left_op(vmg_ &val);
                    p = op_overload(vmg_ p - entry_ptr_native_, -1,
                                    &val, G_predef->operator_bit_and, 1,
                                    VMERR_BAD_TYPE_BIT_AND);
                }
                continue;

            case OPC_BOR:
                /* bitwise OR two integers on top of stack */
                valp = get(0);
                valp2 = get(1);

                /* check the types */
                if (valp->typ == VM_INT && valp2->typ == VM_INT)
                {
                    /* compute the result */
                    valp2->val.intval |= valp->val.intval;

                    /* discard the second operand */
                    discard();
                }
                else
                {
                    /* try for an operator overload */
                    pop_left_op(vmg_ &val);
                    p = op_overload(vmg_ p - entry_ptr_native_, -1,
                                    &val, G_predef->operator_bit_or, 1,
                                    VMERR_BAD_TYPE_BIT_OR);
                }
                continue;

            case OPC_SHL:
                /* 
                 *   bit-shift left integer at (TOS-1) by integer at top
                 *   of stack 
                 */
                valp = get(0);
                valp2 = get(1);

                /* check the types */
                if (valp->typ == VM_INT && valp2->typ == VM_INT)
                {
                    /* compute the result */
                    valp2->val.intval <<= valp->val.intval;

                    /* discard the second operand */
                    discard();
                }
                else
                {
                    /* try for an operator overload */
                    pop_left_op(vmg_ &val);
                    p = op_overload(vmg_ p - entry_ptr_native_, -1,
                                    &val, G_predef->operator_shl, 1,
                                    VMERR_BAD_TYPE_SHL);
                }
                continue;

            case OPC_ASHR:
                /* 
                 *   arithmetic shift right integer at (TOS-1) by integer at
                 *   top of stack 
                 */
                valp = get(0);
                valp2 = get(1);

                /* check types */
                if (valp->typ == VM_INT && valp2->typ == VM_INT)
                {
                    /* compute the result */
                    valp2->val.intval =
                        t3_ashr(valp2->val.intval, valp->val.intval);

                    /* discard the second operand */
                    discard();
                }
                else
                {
                    /* try for an operator overload */
                    pop_left_op(vmg_ &val);
                    p = op_overload(vmg_ p - entry_ptr_native_, -1,
                                    &val, G_predef->operator_ashr, 1,
                                    VMERR_BAD_TYPE_ASHR);
                }
                continue;

            case OPC_LSHR:
                /* 
                 *   logical shift right integer at (TOS-1) by integer at
                 *   top of stack 
                 */
                valp = get(0);
                valp2 = get(1);

                /* check types */
                if (valp->typ == VM_INT && valp2->typ == VM_INT)
                {
                    /* compute the result */
                    valp2->val.intval =
                        t3_lshr(valp2->val.intval, valp->val.intval);

                    /* discard the second operand */
                    discard();
                }
                else
                {
                    /* try for an operator overload */
                    pop_left_op(vmg_ &val);
                    p = op_overload(vmg_ p - entry_ptr_native_, -1,
                                    &val, G_predef->operator_lshr, 1,
                                    VMERR_BAD_TYPE_LSHR);
                }
                continue;

            case OPC_XOR:
                /* XOR two values at top of stack */
                popval_2(vmg_ &val, &val2);
                if (!xor_and_push(vmg_ &val, &val2))
                {
                    /* try for an operator overload */
                    push(&val2);
                    p = op_overload(vmg_ p - entry_ptr_native_, -1,
                                    &val, G_predef->operator_xor, 1,
                                    VMERR_BAD_TYPE_XOR);
                }
                continue;

            case OPC_NOT:
                /* 
                 *   invert the logic value; if the value is a number,
                 *   treat 0 as nil and non-zero as true 
                 */
                valp = get(0);
                switch(valp->typ)
                {
                case VM_NIL:
                    /* !nil -> true */
                    valp->set_true();
                    continue;

                case VM_OBJ:
                    /* !obj -> true if obj is nil, nil otherwise */
                    valp->set_logical(valp->val.obj == VM_INVALID_OBJ);
                    continue;

                case VM_TRUE:
                case VM_PROP:
                case VM_SSTRING:
                case VM_LIST:
                case VM_CODEOFS:
                case VM_FUNCPTR:
                case VM_ENUM:
                    /* these are all considered true, so !them -> nil */
                    valp->set_nil();
                    continue;

                case VM_INT:
                    /* !int -> true if int is 0, nil otherwise */
                    valp->set_logical(valp->val.intval == 0);
                    continue;

                default:
                    err_throw(VMERR_NO_LOG_CONV);
                }
                continue;

            case OPC_BOOLIZE:
                /* set to a boolean value */
                valp = get(0);
                switch(valp->typ)
                {
                case VM_NIL:
                case VM_TRUE:
                    /* it's already a logical value - leave it alone */
                    continue;

                case VM_INT:
                    /* integer: 0 -> nil, non-zero -> true */
                    valp->set_logical(valp->val.intval);
                    continue;

                case VM_ENUM:
                    /* an enum is always non-nil */
                    valp->set_true();
                    continue;

                default:
                    err_throw(VMERR_NO_LOG_CONV);
                }
                continue;

            case OPC_EQ:
                /* compare two values at top of stack for equality */
                push_bool(vmg_ pop2_equal(vmg0_));
                continue;

            case OPC_NE:
                /* compare two values at top of stack for inequality */
                push_bool(vmg_ !pop2_equal(vmg0_));
                continue;

            case OPC_LT:
                /* compare values at top of stack - true if (TOS-1) < TOS */
                push_bool(vmg_ pop2_compare_lt(vmg0_));
                continue;

            case OPC_LE:
                /* compare values at top of stack - true if (TOS-1) <= TOS */
                push_bool(vmg_ pop2_compare_le(vmg0_));
                continue;

            case OPC_GT:
                /* compare values at top of stack - true if (TOS-1) > TOS */
                push_bool(vmg_ pop2_compare_gt(vmg0_));
                continue;

            case OPC_GE:
                /* compare values at top of stack - true if (TOS-1) >= TOS */
                push_bool(vmg_ pop2_compare_ge(vmg0_));
                continue;

            case OPC_VARARGC:
                {
                    /* get the modified opcode */
                    uchar opc = *p++;

                    /* 
                     *   skip the immediate data argument count - this is
                     *   superseded by our dynamic argument counter 
                     */
                    ++p;

                    /* pop the argument counter */
                    pop_int(vmg_ &val);
                    argc = val.val.intval;

                    /* execute the appropriate next opcode */
                    switch(opc)
                    {
                    case OPC_CALL:
                        goto do_opc_call;

                    case OPC_PTRCALL:
                        goto do_opc_ptrcall;

                    case OPC_CALLPROP:
                        goto do_opc_callprop;

                    case OPC_PTRCALLPROP:
                        goto do_opc_ptrcallprop;

                    case OPC_CALLPROPSELF:
                        goto do_opc_callpropself;

                    case OPC_PTRCALLPROPSELF:
                        goto do_opc_ptrcallpropself;

                    case OPC_OBJCALLPROP:
                        goto do_opc_objcallprop;

                    case OPC_CALLPROPLCL1:
                        goto do_opc_callproplcl1;

                    case OPC_CALLPROPR0:
                        goto do_opc_callpropr0;

                    case OPC_INHERIT:
                        goto do_opc_inherit;

                    case OPC_PTRINHERIT:
                        goto do_opc_ptrinherit;

                    case OPC_EXPINHERIT:
                        goto do_opc_expinherit;

                    case OPC_PTREXPINHERIT:
                        goto do_opc_ptrexpinherit;

                    case OPC_DELEGATE:
                        goto do_opc_delegate;

                    case OPC_PTRDELEGATE:
                        goto do_opc_ptrdelegate;

                    case OPC_BUILTIN_A:
                        goto do_opc_builtin_a;

                    case OPC_BUILTIN_B:
                        goto do_opc_builtin_b;

                    case OPC_BUILTIN_C:
                        goto do_opc_builtin_c;

                    case OPC_BUILTIN_D:
                        goto do_opc_builtin_d;

                    case OPC_BUILTIN1:
                        goto do_opc_builtin1;

                    case OPC_BUILTIN2:
                        goto do_opc_builtin2;

                    case OPC_NEW1:
                        goto do_opc_new1;

                    case OPC_TRNEW1:
                        goto do_opc_trnew1;

                    case OPC_NEW2:
                        goto do_opc_new2;

                    case OPC_TRNEW2:
                        goto do_opc_trnew2;

                    default:
                        err_throw(VMERR_INVALID_OPCODE_MOD);
                        continue;
                    }
                }
                continue;

            case OPC_NAMEDARGPTR:
                /* 
                 *   Pointer to named argument table.  Discard the named
                 *   arguments (the count is given by a one-byte operand),
                 *   then skip the table pointer (a two-byte operand).  
                 */
                discard(get_op_uint8(&p));
                p += 2;
                continue;

            case OPC_NAMEDARGTAB:
                /* 
                 *   Named argument table.  As with NAMEDARGPTR, we must
                 *   discard the named arguments.  Then we simply skip the
                 *   table - the table is for the benefit of callees. 
                 */
                {
                    pool_ofs_t ofs = get_op_uint16(&p);
                    discard(get_op_uint16(&p));
                    p += ofs - 2;
                }
                continue;

            case OPC_CALL:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_call:
                {
                    /* get the code offset to invoke */
                    pool_ofs_t ofs = get_op_int32(&p);

                    /* call it */
                    p = do_call_func_nr(vmg_ p - entry_ptr_native_, ofs, argc);
                }
                continue;

            case OPC_PTRCALL:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_ptrcall:
                /* retrieve the target of the call */
                popval(vmg_ &val);

                /* 
                 *   if it's a prop ID, and there's a valid "self" object,
                 *   treat it as a PTRCALLPROPSELF 
                 */
                if (val.typ == VM_PROP
                    && get_self_check(vmg0_) != VM_INVALID_OBJ)
                    goto do_opc_ptrcallpropself_val;
                
                /* call the function */
                p = call_func_ptr(vmg_ &val, argc, 0, p - entry_ptr_native_);
                continue;

            case OPC_RETTRUE:
                /* store true in R0 */
                r0_.set_true();

                /* return */
                if ((p = do_return(vmg0_)) == 0)
                    goto exit_loop;
                continue;

            case OPC_GETPROPR0:
                /* evaluate the property of R0 */
                propev.self = r0_;
                prop = get_op_uint16(&p);
                p = propev.get_prop(vmg_ p - entry_ptr_native_, prop);
                continue;

            case OPC_CALLPROPLCL1:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_callproplcl1:
                /* get the local whose property we're calling */
                propev.self = *get_local(vmg_ get_op_uint8(&p));

                /* call the property of the local */
                prop = get_op_uint16(&p);
                p = propev.get_prop(vmg_ p - entry_ptr_native_, prop, argc);
                continue;

            case OPC_CALLPROPR0:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_callpropr0:
                /* call the property of R0 */
                propev.self = r0_;
                prop = get_op_uint16(&p);
                p = propev.get_prop(vmg_ p - entry_ptr_native_, prop, argc);
                continue;

            case OPC_PTRCALLPROP:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_ptrcallprop:
                /* 
                 *   pop the property to be evaluated, and the object whose
                 *   property we're evaluating 
                 */
                pop_prop(vmg_ &val);
                pop(&propev.self);

                /* evaluate the property */
                p = propev.get_prop(vmg_ p - entry_ptr_native_,
                                    val.val.prop, argc);
                continue;

            case OPC_PTRCALLPROPSELF:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_ptrcallpropself:
                /* get the property to be evaluated */
                pop_prop(vmg_ &val);

            do_opc_ptrcallpropself_val:
                /* evaluate the property of 'self' */
                propev.self.set_obj(get_self(vmg0_));
                p = propev.get_prop(vmg_ p - entry_ptr_native_,
                                    val.val.prop, argc);
                continue;

            case OPC_OBJGETPROP:
                /* get the object */
                propev.self.set_obj((vm_obj_id_t)get_op_uint32(&p));

                /* evaluate the property */
                prop = get_op_uint16(&p);
                p = propev.get_prop(vmg_ p - entry_ptr_native_, prop);
                continue;

            case OPC_OBJCALLPROP:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_objcallprop:
                /* get the object */
                propev.self.set_obj((vm_obj_id_t)get_op_uint32(&p));

                /* evaluate the property */
                prop = get_op_uint16(&p);
                p = propev.get_prop(vmg_ p - entry_ptr_native_, prop, argc);
                continue;

            case OPC_GETLCL1:
                /* push the local */
                pushval(vmg_ get_local(vmg_ get_op_uint8(&p)));
                continue;

            case OPC_GETLCLN5:
                pushval(vmg_ get_local(vmg_ 5));
                continue;

            case OPC_GETLCL2:
                /* push the local */
                pushval(vmg_ get_local(vmg_ get_op_uint16(&p)));
                continue;

            case OPC_GETARG1:
                /* push the argument */
                pushval(vmg_ get_param(vmg_ get_op_uint8(&p)));
                continue;

            case OPC_GETARG2:
                /* push the argument */
                pushval(vmg_ get_param(vmg_ get_op_uint16(&p)));
                continue;

            case OPC_SETSELF:
                /* retrieve the 'self' object */
                pop(&val);
                
                /* if it's nil, set the 'obj' field to null */
                if (val.typ == VM_NIL)
                    val.val.obj = VM_INVALID_OBJ;

                /* set 'self' */
                set_self(vmg_ &val);
                continue;

            case OPC_STORECTX:
                /* create the context object */
                create_loadctx_obj(vmg_ push(),
                                   get_self(vmg0_),
                                   get_defining_obj(vmg0_),
                                   get_orig_target_obj(vmg0_),
                                   get_target_prop(vmg0_));
                continue;

            case OPC_LOADCTX:
                {
                    /* 
                     *   convert the context object (at top of stack) to a
                     *   list pointer 
                     */
                    const char *lstp = get(0)->get_as_list(vmg0_);

                    /* throw an error if it's not what we're expecting */
                    if (lstp == 0 || vmb_get_len(lstp) < 4)
                        err_throw(VMERR_LIST_VAL_REQD);

                    /* retrieve and store the context elements */
                    set_method_ctx(
                        vmg_ vmb_get_dh_obj(lstp + VMB_LEN),
                        vmb_get_dh_prop(lstp + VMB_LEN
                                        + VMB_DATAHOLDER),
                        vmb_get_dh_obj(lstp + VMB_LEN
                                       + 2*VMB_DATAHOLDER),
                        vmb_get_dh_obj(lstp + VMB_LEN
                                       + 3*VMB_DATAHOLDER));

                    /* discard the context object at top of stack */
                    discard();
                }
                continue;

            case OPC_PUSHCTXELE:
                /* check our context element type */
                switch(*p++)
                {
                case PUSHCTXELE_TARGPROP:
                    /* push the target property ID */
                    push(get_from_frame(frame_ptr_, VMRUN_FPOFS_PROP));
                    continue;

                case PUSHCTXELE_TARGOBJ:
                    /* push the original target object ID */
                    push(get_from_frame(frame_ptr_, VMRUN_FPOFS_ORIGTARG));
                    continue;

                case PUSHCTXELE_DEFOBJ:
                    /* push the defining object */
                    push(get_from_frame(frame_ptr_, VMRUN_FPOFS_DEFOBJ));
                    continue;

                case PUSHCTXELE_INVOKEE:
                    /* push the invokee object */
                    push(get_from_frame(frame_ptr_, VMRUN_FPOFS_INVOKEE));
                    continue;

                default:
                    /* the opcode is not valid in this VM version */
                    err_throw(VMERR_INVALID_OPCODE);
                }
                continue;

            case OPC_GETARGC:
                /* push the argument counter */
                push_int(vmg_ get_cur_argc(vmg0_));
                continue;

            case OPC_DUP2:
                /* 
                 *   duplicate the top two elements: first push the
                 *   second-from-top, then push the old top (which will now
                 *   be the second-from-top, thanks to our first push) 
                 */
                pushval(vmg_ get(1));
                pushval(vmg_ get(1));
                continue;

            case OPC_SWITCH:
                {
                    /* get the control value */
                    valp = get(0);

                    /* get the case count */
                    uint cnt = get_op_uint16(&p);

                    /* iterate through the case table */
                    for ( ; cnt != 0 ; p += 7, --cnt)
                    {
                        /* get this value */
                        vmb_get_dh((const char *)p, &val2);
                        
                        /* check if the values match */
                        if (valp->equals(vmg_ &val2))
                        {
                            /* it matches - jump to this offset */
                            p += VMB_DATAHOLDER;
                            p += osrp2s(p);
                            
                            /* no need to look any further */
                            break;
                        }
                    }

                    /* discard the control value */
                    discard();

                    /* if we didn't find it, jump to the default case */
                    if (cnt == 0)
                        p += osrp2s(p);
                }
                continue;

            case OPC_JT:
                /* get the value */
                valp = get(0);

                /* 
                 *   if it's true, or a non-zero numeric value, or any
                 *   non-numeric and non-boolean value, jump 
                 */
                if (false_for_cond(valp))
                {
                    /* it's zero or nil - do not jump */
                    p += 2;
                }
                else
                {
                    /* it's non-zero and non-nil - jump */
                    p += osrp2s(p);
                }

                /* discard the value */
                discard();
                continue;

            case OPC_JR0T:
                /* 
                 *   if R0 is true, or it's a non-zero numeric value, or any
                 *   non-numeric and non-boolean value, jump 
                 */
                if (false_for_cond(&r0_))
                {
                    /* it's zero or nil - do not jump */
                    p += 2;
                }
                else
                {
                    /* it's non-zero and non-nil - jump */
                    p += osrp2s(p);
                }
                continue;

            case OPC_JF:
                /* get the value */
                valp = get(0);

                /* 
                 *   if it's true, or a non-zero numeric value, or any
                 *   non-numeric and non-boolean value, do not jump;
                 *   otherwise, jump 
                 */
                if (false_for_cond(valp))
                {
                    /* it's zero or nil - jump */
                    p += osrp2s(p);
                }
                else
                {
                    /* it's non-zero and non-nil - do not jump */
                    p += 2;
                }

                /* discard the value */
                discard();
                continue;

            case OPC_JGE:
                /* jump if greater or equal */
                p += (pop2_compare_ge(vmg0_) ? osrp2s(p) : 2);
                continue;

            case OPC_JLT:
                /* jump if less */
                p += (pop2_compare_lt(vmg0_) ? osrp2s(p) : 2);
                continue;

            case OPC_JLE:
                /* jump if less or equal */
                p += (pop2_compare_le(vmg0_) ? osrp2s(p) : 2);
                continue;

            case OPC_JST:
                /* get (do not remove) the element at top of stack */
                valp = get(0);

                /* 
                 *   if it's true, an enum value, or a non-zero number, jump,
                 *   saving the value; otherwise, require that it be a
                 *   logical value, pop it, and proceed 
                 */
                if (true_for_cond(valp))
                {
                    /* it's true - save it and jump */
                    p += osrp2s(p);
                }
                else
                {
                    /* 
                     *   it's not true - discard the value, but require
                     *   that it be a valid logical value 
                     */
                    if (!is_valid_for_jst(valp))
                        err_throw(VMERR_LOG_VAL_REQD);
                    discard();

                    /* skip to the next instruction */
                    p += 2;
                }
                continue;

            case OPC_JSF:
                /* get (do not remove) the element at top of stack */
                valp = get(0);

                /* 
                 *   if it's nil or zero, jump, saving the value;
                 *   otherwise, discard the value and proceed 
                 */
                if (false_for_cond(valp))
                {
                    /* it's nil or zero - save it and jump */
                    p += osrp2s(p);
                }
                else
                {
                    /* it's something non-false - discard it */
                    discard();

                    /* skip to the next instruction */
                    p += 2;
                }
                continue;

            case OPC_LJSR:
                /* 
                 *   compute and push the offset of the next instruction
                 *   (at +2 because of the branch offset operand) from our
                 *   method header - this will be the return address,
                 *   which in this offset format will survive any code
                 *   swapping that might occur in subsequent execution 
                 */
                push_int(vmg_ pc_to_method_ofs(p + 2));

                /* jump to the target address */
                p += osrp2s(p);
                continue;

            case OPC_LRET:
                /* get the indicated local variable */
                valp = get_local(vmg_ get_op_uint16(&p));
                
                /* the value must be an integer */
                if (valp->typ != VM_INT)
                    err_throw(VMERR_INT_VAL_REQD);
                
                /* 
                 *   jump to the code address obtained from adding the
                 *   integer value in the given local variable to the
                 *   current method header pointer 
                 */
                p = entry_ptr_native_ + valp->val.intval;
                continue;

            case OPC_SWAP:
                /* swap the top two elements on the stack */
                valp = get(0);
                valp2 = get(1);

                /* make a working copy of TOS */
                val = *valp;

                /* copy TOS-1 over TOS */
                *valp = *valp2;

                /* copy the working copy of TOS over TOS-1 */
                *valp2 = val;
                continue;

            case OPC_SWAP2:
                /* swap the top two elements with the next two */
                valp = get(0);
                valp2 = get(1);

                /* make a working copy of elements 2 & 3 */
                val = *get(2);
                val2 = *get(3);

                /* copy 0,1 over 2,3 */
                *get(2) = *valp;
                *get(3) = *valp2;

                /* copy the saved 2,3 over 0,1 */
                *valp = val;
                *valp2 = val2;
                continue;

            case OPC_SWAPN:
                /* swap elements at two given stack indices */
                valp = get(get_op_uint8(&p));
                valp2 = get(get_op_uint8(&p));

                /* make a working copy of val1 */
                val = *valp;

                /* write val2 over val1 */
                *valp = *valp2;

                /* write the copy of val1 over val2 */
                *valp2 = val;
                continue;

            case OPC_GETSPN:
                /* push stack element at index */
                push(get(get_op_uint8(&p)));
                continue;

            case OPC_SAY:
                {
                    /* get the string offset */
                    pool_ofs_t ofs = get_op_int32(&p);

                    /* display it */
                    p = disp_dstring(vmg_ ofs, p - entry_ptr_native_,
                                     get_self_check(vmg0_));
                }
                continue;

            case OPC_SAYVAL:
                /* invoke the default string display function */
                p = disp_string_val(vmg_ p - entry_ptr_native_,
                                    get_self_check(vmg0_));
                continue;

            case OPC_INHERIT:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_inherit:
                /* inherit the property */
                prop = (vm_prop_id_t)get_op_uint16(&p);
                p = inh_prop(vmg_ p - entry_ptr_native_, prop, argc);
                continue;

            case OPC_PTRINHERIT:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_ptrinherit:
                /* pop the property to be inherited */
                pop_prop(vmg_ &val);

                /* inherit it */
                p = inh_prop(vmg_ p - entry_ptr_native_, val.val.prop, argc);
                continue;

            case OPC_EXPINHERIT:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_expinherit:
                /* get the property to inherit */
                prop = (vm_prop_id_t)get_op_uint16(&p);

                /* get the superclass to inherit it from */
                val.set_obj((vm_obj_id_t)get_op_uint32(&p));

                /* 
                 *   inherit it -- process this essentially the same way
                 *   as a normal CALLPROP, since we're going to evaluate
                 *   the given property of the given object, but retain
                 *   the current 'self' object 
                 */
                val2.set_obj(get_self(vmg0_));
                p = get_prop(vmg_ p - entry_ptr_native_,
                             &val, prop, &val2, argc, 0);
                continue;

            case OPC_PTREXPINHERIT:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_ptrexpinherit:
                /* pop the property to inherit */
                pop_prop(vmg_ &val);

                /* get the superclass to inherit it from */
                val3.set_obj((vm_obj_id_t)get_op_uint32(&p));

                /* inherit it */
                val2.set_obj(get_self(vmg0_));
                p = get_prop(vmg_ p - entry_ptr_native_,
                             &val3, val.val.prop, &val2, argc, 0);
                continue;

            case OPC_DELEGATE:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_delegate:
                /* get the property to inherit */
                prop = (vm_prop_id_t)get_op_uint16(&p);

                /* get the object to delegate to */
                pop(&val);

                /* delegate it */
                val2.set_obj(get_self(vmg0_));

                p = get_prop(vmg_ p - entry_ptr_native_,
                             &val, prop, &val2, argc, 0);
                continue;

            case OPC_PTRDELEGATE:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_ptrdelegate:
                /* pop the property to delegate to */
                pop_prop(vmg_ &val);

                /* pop the object to delegate to */
                pop(&val2);

                /* delegate it */
                val3.set_obj(get_self(vmg0_));
                p = get_prop(vmg_ p - entry_ptr_native_,
                             &val2, val.val.prop, &val3, argc, 0);
                continue;

            case OPC_BUILTIN_A:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_builtin_a:
                {
                    /* get the function index */
                    uint idx = get_op_uint8(&p);
                    
                    /* call the function in set #0 */
                    call_bif(vmg_ 0, idx, argc);
                }
                continue;

            case OPC_BUILTIN_B:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_builtin_b:
                {
                    /* get the function index */
                    uint idx = get_op_uint8(&p);

                    /* call the function in set #1 */
                    call_bif(vmg_ 1, idx, argc);
                }
                continue;

            case OPC_BUILTIN_C:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_builtin_c:
                {
                    /* get the function index */
                    uint idx = get_op_uint8(&p);

                    /* call the function in set #2 */
                    call_bif(vmg_ 2, idx, argc);
                }
                continue;

            case OPC_BUILTIN_D:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_builtin_d:
                {
                    /* get the function index */
                    uint idx = get_op_uint8(&p);
                    
                    /* call the function in set #3 */
                    call_bif(vmg_ 3, idx, argc);
                }
                continue;

            case OPC_BUILTIN1:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_builtin1:
                {
                    /* get the function index and function set ID */
                    uint idx = get_op_uint8(&p);
                    uint set_idx = get_op_uint8(&p);
                    
                    /* call the function */
                    call_bif(vmg_ set_idx, idx, argc);
                }
                continue;

            case OPC_BUILTIN2:
                /* get the argument count */
                argc = get_op_uint8(&p);

            do_opc_builtin2:
                {
                    /* get the function index and function set ID */
                    uint idx = get_op_uint16(&p);
                    uint set_idx = get_op_uint8(&p);

                    /* call the function in set #0 */
                    call_bif(vmg_ set_idx, idx, argc);
                }
                continue;

            case OPC_IDXINT8:
                /* 
                 *   make a copy of the value to index, so we can overwrite
                 *   the stack slot with the result 
                 */
                val = *(valp = get(0));

                /* set up the index value */
                val2.set_int(get_op_uint8(&p));

                /* apply the index, storing the result at TOS */
                if (!apply_index(vmg_ valp, &val, &val2))
                {
                    /* 
                     *   try an operator overload - push the index value as
                     *   the argument 
                     */
                    pop(&val);
                    push(&val2);
                    p = op_overload(vmg_ p - entry_ptr_native_, -1,
                                    &val, G_predef->operator_idx, 1,
                                    VMERR_CANNOT_INDEX_TYPE);
                }
                continue;

            case OPC_NEW1:
                /* get the argument count */
                argc = get_op_uint8(&p);

                /* fall through to do_opc_new1 */
            do_opc_new1:
                {
                    /* get the metaclass ID and create the object */
                    uint idx = get_op_uint8(&p);
                    p = new_and_store_r0(vmg_ p, idx, argc, FALSE);
                }
                continue;

            case OPC_TRNEW1:
                /* get the argument count */
                argc = get_op_uint8(&p);

                /* fall through to do_opc_trnew1 */

            do_opc_trnew1:
                {
                    /* get the metaclass ID and create the object */
                    uint idx = get_op_uint8(&p);
                    p = new_and_store_r0(vmg_ p, idx, argc, TRUE);
                }
                continue;

            case OPC_NEW2:
                /* get the argument count */
                argc = get_op_uint16(&p);

                /* fall through to do_opc_new2 */
            do_opc_new2:
                {
                    /* get the metaclass ID */
                    uint idx = get_op_uint16(&p);

                    /* create the new object */
                    p = new_and_store_r0(vmg_ p, idx, argc, FALSE);
                }
                continue;

            case OPC_TRNEW2:
                /* get the argument count */
                argc = get_op_uint16(&p);

                /* fall through to do_opc_trnew2 */
            do_opc_trnew2:
                {
                    /* get the metaclass ID */
                    uint idx = get_op_uint16(&p);

                    /* create the new object */
                    p = new_and_store_r0(vmg_ p, idx, argc, TRUE);
                }
                continue;

            case OPC_NOP:
                /* NO OP - no effect */
                continue;

            case OPC_INCLCL:
                /* get the local */
                {
                    int itmp = get_op_uint16(&p);
                    valp = get_local(vmg_ itmp);
                
                    /* do the increment inline if it's an integer */
                    if (valp->typ == VM_INT)
                    {
                        /* it's a number - just increment the value */
                        INT_ADD(valp, 1);
                    }
                    else
                    {
                        /* it's a non-numeric value - do the full addition */
                        val2.set_int(1);
                        if (!compute_sum(vmg_ valp, &val2))
                        {
                            /* 
                             *   Check for an operator overload.  We need to
                             *   do this with a recursive call to update the
                             *   local on return. 
                             */
                            push(&val2);
                            p = op_overload(vmg_ p - entry_ptr_native_, itmp,
                                            valp, G_predef->operator_add, 1,
                                            VMERR_BAD_TYPE_ADD);
                        }
                    }
                }
                continue;

            case OPC_DECLCL:
                {
                    /* get the local */
                    int itmp = get_op_uint16(&p);
                    valp = get_local(vmg_ itmp);
                    
                    /* handle integers inline */
                    if (valp->typ == VM_INT)
                    {
                        /* it's a number - just decrement the value */
                        INT_SUB(valp, 1);
                    }
                    else
                    {
                        /* non-int - we must do the full subtraction work */
                        val2.set_int(1);
                        if (!compute_diff(vmg_ valp, &val2))
                        {
                            /* 
                             *   Check for an operator overload.  We need to
                             *   do this with a recursive call to update the
                             *   local on return.  
                             */
                            push(&val2);
                            p = op_overload(vmg_ p - entry_ptr_native_, itmp,
                                            valp, G_predef->operator_sub, 1,
                                            VMERR_BAD_TYPE_SUB);
                        }
                    }
                }
                continue;

            case OPC_ADDILCL1:
                {
                    /* get the local */
                    int itmp = get_op_uint8(&p);
                    valp = get_local(vmg_ itmp);
                    
                    /* handle it inline if it's an integer */
                    if (valp->typ == VM_INT)
                    {
                        /* it's a number - just add the value */
                        INT_ADD(valp, get_op_int8(&p));
                    }
                    else
                    {
                        /* get the number to add */
                        val2.set_int(get_op_int8(&p));

                        /* compute the sum */
                        p = compute_sum_lcl_imm(vmg_ valp, &val2, itmp, p);
                    }
                }
                continue;

            case OPC_ADDILCL4:
                {
                    /* get the local */
                    int itmp = get_op_uint16(&p);
                    valp = get_local(vmg_ itmp);
                    
                    /* if it's an integer, handle it in-line */
                    if (valp->typ == VM_INT)
                    {
                        /* it's a number - just add the value */
                        INT_ADD(valp, get_op_int32(&p));
                    }
                    else
                    {
                        /* get the number to add */
                        val2.set_int(get_op_int32(&p));

                        /* compute the sum */
                        p = compute_sum_lcl_imm(vmg_ valp, &val2, itmp, p);
                    }
                }
                continue;

            case OPC_ADDTOLCL:
                {
                    /* get the local */
                    int itmp = get_op_uint16(&p);
                    valp = get_local(vmg_ itmp);
                    
                    /* get the value to add */
                    valp2 = get(0);
                    
                    /* if they're both integers, handle in-line */
                    if (valp->typ == VM_INT && valp2->typ == VM_INT)
                    {
                        /* add the value to the local */
                        INT_ADD(valp, valp2->val.intval);
                        
                        /* done with the addend */
                        discard();
                    }
                    else
                    {
                        /* compute the sum, leaving the result in the local */
                        if (compute_sum(vmg_ valp, valp2))
                        {
                            /* done - discard the addend */
                            discard();
                        }
                        else
                        {
                            /* 
                             *   check for an overload - do it recursively,
                             *   since we need to update the local on return 
                             */
                            push(valp2);
                            p = op_overload(vmg_ p - entry_ptr_native_, itmp,
                                            valp, G_predef->operator_add, 1,
                                            VMERR_BAD_TYPE_ADD);
                        }
                    }
                }
                continue;

            case OPC_SUBFROMLCL:
                {
                    /* get the local */
                    int itmp = get_op_uint16(&p);
                    valp = get_local(vmg_ itmp);
                    
                    /* get the value to add */
                    valp2 = get(0);
                    
                    /* if they're both integers, handle in-line */
                    if (valp->typ == VM_INT && valp2->typ == VM_INT)
                    {
                        /* subtract the value from the local */
                        INT_SUB(valp, valp2->val.intval);
                        
                        /* discard the subtrahend */
                        discard();
                    }
                    else if (compute_diff(vmg_ valp, valp2))
                    {
                        /* done - discard the subtrahend */
                        discard();
                    }
                    else
                    {
                        /* 
                         *   no native implementation - check for an
                         *   overload; do this recursively since we need to
                         *   update the local on return
                         */
                        push(valp2);
                        p = op_overload(vmg_ p - entry_ptr_native_, itmp,
                                        valp, G_predef->operator_sub, 1,
                                        VMERR_BAD_TYPE_SUB);
                    }
                }
                continue;

            case OPC_ZEROLCL1:
                /* get the local and set it to zero */
                get_local(vmg_ get_op_uint8(&p))->set_int(0);
                continue;

            case OPC_ZEROLCL2:
                /* get the local and set it to zero */
                get_local(vmg_ get_op_uint16(&p))->set_int(0);
                continue;

            case OPC_NILLCL1:
                /* get the local and set it to zero */
                get_local(vmg_ get_op_uint8(&p))->set_nil();
                continue;

            case OPC_NILLCL2:
                /* get the local and set it to zero */
                get_local(vmg_ get_op_uint16(&p))->set_nil();
                continue;

            case OPC_ONELCL1:
                /* get the local and set it to zero */
                get_local(vmg_ get_op_uint8(&p))->set_int(1);
                continue;

            case OPC_ONELCL2:
                /* get the local and set it to zero */
                get_local(vmg_ get_op_uint16(&p))->set_int(1);
                continue;

            case OPC_SETLCL2:
                /* get a pointer to the local */
                valp = get_local(vmg_ get_op_uint16(&p));

                /* pop the value into the local */
                popval(vmg_ valp);
                continue;

            case OPC_SETARG1:
                /* get a pointer to the parameter */
                valp = get_param(vmg_ get_op_uint8(&p));

                /* pop the value into the parameter */
                popval(vmg_ valp);
                continue;

            case OPC_SETARG2:
                /* get a pointer to the parameter */
                valp = get_param(vmg_ get_op_uint16(&p));

                /* pop the value into the parameter */
                popval(vmg_ valp);
                continue;

            case OPC_SETIND:
                /* pop the index */
                popval(vmg_ &val2);

                /* pop the value to be indexed */
                popval(vmg_ &val);

                /* pop the value to assign */
                popval(vmg_ &val3);

                /* assign into the index */
                if (set_index(vmg_ &val, &val2, &val3))
                {
                    /* push the new container value */
                    pushval(vmg_ &val);
                }
                else
                {
                    /* try operator overloading */
                    push(&val3);
                    push(&val2);
                    p = op_overload(vmg_ p - entry_ptr_native_, -1,
                                    &val, G_predef->operator_setidx, 2,
                                    VMERR_CANNOT_INDEX_TYPE);
                }
                continue;

            case OPC_SETINDLCL1I8:
                {
                    /* get the local */
                    int itmp = get_op_uint8(&p);
                    valp = get_local(vmg_ itmp);
                    
                    /* get the index value */
                    val2.set_int(get_op_uint8(&p));
                    
                    /* pop the value to assign */
                    popval(vmg_ &val3);
                    
                    /* 
                     *   set the index value - this will update the local
                     *   variable directly if the container value changes 
                     */
                    if (!set_index(vmg_ valp, &val2, &val3))
                    {
                        /* try operator overloading */
                        push(&val3);
                        push(&val2);
                        p = op_overload(vmg_ p - entry_ptr_native_, itmp,
                                        valp, G_predef->operator_setidx, 2,
                                        VMERR_CANNOT_INDEX_TYPE);
                    }
                }
                continue;

            case OPC_SETPROP:
                /* get the object whose property we're setting */
                pop_obj(vmg_ &val);

                /* pop the value we're setting */
                popval(vmg_ &val2);

                /* set the value */
                set_prop(vmg_ val.val.obj, get_op_uint16(&p), &val2);
                continue;

            case OPC_PTRSETPROP:
                /* get the property and object to set */
                pop_prop(vmg_ &val);
                pop_obj(vmg_ &val2);

                /* get the value to set */
                popval(vmg_ &val3);

                /* set it */
                set_prop(vmg_ val2.val.obj, val.val.prop, &val3);
                continue;

            case OPC_OBJSETPROP:
                /* get the object */
                obj = (vm_obj_id_t)get_op_uint32(&p);

                /* get the new value */
                popval(vmg_ &val);

                /* set the property */
                set_prop(vmg_ obj, get_op_uint16(&p), &val);
                continue;

            case OPC_PUSHSTRI:
                /* push inline string */
                {
                    /* get the length prefix */
                    uint cnt = get_op_uint16(&p);

                    /* create the new string from the inline data */
                    obj = CVmObjString::create(
                        vmg_ FALSE, (const char *)p, cnt);

                    /* skip past the string's bytes */
                    p += cnt;

                    /* push the new string */
                    push()->set_obj(obj);
                }
                continue;

            case OPC_PUSHBIFPTR:
                {
                    /* push pointer to built-in function */
                    uint idx = get_op_uint16(&p);
                    push()->set_bifptr(get_op_uint16(&p), (ushort)idx);
                    validate_bifptr(vmg0_);
                }
                continue;

            case OPC_THROW:
                /* pop the exception object */
                pop_obj(vmg_ &val);

                /* 
                 *   Throw it.  Note that we pass the start of the current
                 *   instruction as the program counter, since we want to
                 *   find the exception handler (if any) for the current
                 *   instruction, not for the next instruction. 
                 */
                if ((p = do_throw(vmg_ p - 1, val.val.obj)) == 0)
                {
                    /* remember the unhandled exception for re-throwing */
                    unhandled_exc = val.val.obj;

                    /* terminate execution */
                    goto exit_loop;
                }
                continue;

#ifdef VM_DEBUGGER

            case OPC_GETPROPDATA:
                /* get the object whose property we're fetching */
                pop(&propev.self);

                /* 
                 *   if the object is not an object, it's one of the native
                 *   types, in which case we'll definitely run native code to
                 *   evaluate the property, in which case it's not valid for
                 *   speculative evaluation 
                 */
                if (propev.self.typ != VM_OBJ)
                    err_throw(VMERR_BAD_SPEC_EVAL);

                /* get the property */
                prop = (vm_prop_id_t)get_op_uint16(&p);

                /* check validity for speculative evaluation */
                check_prop_spec_eval(vmg_ propev.self.val.obj, prop);

                /* evaluate the property given by the immediate data */
                p = propev.get_prop(vmg_ p - entry_ptr_native_, prop);
                continue;

            case OPC_PTRGETPROPDATA:
                /* get the property and object to evaluate */
                pop_prop(vmg_ &val);
                pop(&propev.self);

                /* 
                 *   if the object is not an object, it's one of the native
                 *   types, in which case we'll definitely run native code to
                 *   evaluate the property, in which case it's not valid for
                 *   speculative evaluation 
                 */
                if (propev.self.typ != VM_OBJ)
                    err_throw(VMERR_BAD_SPEC_EVAL);

                /* check validity for speculative evaluation */
                check_prop_spec_eval(vmg_ propev.self.val.obj, val.val.prop);

                /* evaluate it */
                p = propev.get_prop(vmg_ p - entry_ptr_native_, val.val.prop);
                continue;

            case OPC_GETDBARGC:
                /* push the argument count from the selected frame */
                push_int(vmg_ get_argc_at_level(vmg_ get_op_uint16(&p) + 1));
                continue;

            case OPC_GETDBLCL:
                {
                    /* get the local variable number and stack level */
                    uint idx = get_op_uint16(&p);
                    int level = get_op_uint16(&p);

                    /* push the value */
                    pushval(vmg_ get_local_at_level(vmg_ idx, level + 1));
                }
                continue;

            case OPC_GETDBARG:
                {
                    /* get the parameter variable number and stack level */
                    uint idx = get_op_uint16(&p);
                    int level = get_op_uint16(&p);

                    /* push the value */
                    pushval(vmg_ get_param_at_level(vmg_ idx, level + 1));
                }
                continue;

            case OPC_SETDBLCL:
                {
                    /* get the local variable number and stack level */
                    uint idx = get_op_uint16(&p);
                    int level = get_op_uint16(&p);

                    /* get the local pointer */
                    vm_val_t *valp = get_local_at_level(vmg_ idx, level + 1);

                    /* pop the value into the local */
                    popval(vmg_ valp);
                }
                continue;

            case OPC_SETDBARG:
                {
                    /* get the parameter variable number and stack level */
                    uint idx = get_op_uint16(&p);
                    int level = get_op_uint16(&p);

                    /* get the parameter pointer */
                    vm_val_t *valp = get_param_at_level(vmg_ idx, level + 1);

                    /* pop the value into the local */
                    popval(vmg_ valp);
                }
                continue;

            case OPC_BP:
                /* step back to the breakpoint location itself */
                --p;

                /* let the debugger take control */
                G_debugger->step(vmg_ &p, entry_ptr_native_, TRUE, 0);

                /* if we're halting, get out of here */
                if (halt_vm_)
                    err_throw(VMERR_DBG_HALT);

                /* 
                 *   go back and execute the current instruction - bypass
                 *   single-step tracing into the debugger in this case,
                 *   since the debugger expects when it returns that one
                 *   instruction will always be traced before the debugger is
                 *   re-entered 
                 */
                goto exec_instruction;

#else /* VM_DEBUGGER */

            case OPC_GETDBARGC:
            case OPC_GETDBLCL:
            case OPC_GETDBARG:
            case OPC_SETDBLCL:
            case OPC_SETDBARG:
            case OPC_GETPROPDATA:
            case OPC_PTRGETPROPDATA:
                err_throw(VMERR_NO_DEBUGGER);
                continue;

            case OPC_BP:
                /* if there's no debugger, it's an error */
                err_throw(VMERR_BREAKPOINT);
                continue;

#endif /* VM_DEBUGGER */

            case OPC_CALLEXT:
                //$$$
                err_throw(VMERR_CALLEXT_NOT_IMPL);
                continue;

#ifdef OS_FILL_OUT_CASE_TABLES
            /*
             *   Since we this switch is the innermost inner loop of the VM,
             *   we go to some extra lengths to optimize it where possible.
             *   See tads2/osifc.h for information on how to use
             *   OS_FILL_OUT_CASE_TABLES and OS_IMPOSSIBLE_DEFAULT_CASE.
             *   
             *   Our controlling expression is an unsigned character value,
             *   so we know the range of possible values will be limited to
             *   0-255.  Therefore, we simply need to provide a "case"
             *   alternative for every invalid opcode.  To further encourage
             *   the compiler to favor speed here, we specifically put
             *   different code in every one of these case alternatives, to
             *   force the compiler to generate a separate jump location for
             *   each one; some compilers will generate a two-level jump
             *   table if many cases point to shared code, to reduce the size
             *   of the table, but we don't want that here because this
             *   switch is critical to VM performance so we want it as fast
             *   as possible.  
             */
            case 0x00: val.val.intval = 0x00;
            case 0x11: val.val.intval = 0x11;
            case 0x12: val.val.intval = 0x12;
            case 0x13: val.val.intval = 0x13;
            case 0x14: val.val.intval = 0x14;
            case 0x15: val.val.intval = 0x15;
            case 0x16: val.val.intval = 0x16;
            case 0x17: val.val.intval = 0x17;
            case 0x18: val.val.intval = 0x18;
            case 0x19: val.val.intval = 0x19;
            case 0x1A: val.val.intval = 0x1A;
            case 0x1B: val.val.intval = 0x1B;
            case 0x1C: val.val.intval = 0x1C;
            case 0x1D: val.val.intval = 0x1D;
            case 0x1E: val.val.intval = 0x1E;
            case 0x1F: val.val.intval = 0x1F;
            case 0x31: val.val.intval = 0x31;
            case 0x32: val.val.intval = 0x32;
            case 0x33: val.val.intval = 0x33;
            case 0x34: val.val.intval = 0x34;
            case 0x35: val.val.intval = 0x35;
            case 0x36: val.val.intval = 0x36;
            case 0x37: val.val.intval = 0x37;
            case 0x38: val.val.intval = 0x38;
            case 0x39: val.val.intval = 0x39;
            case 0x3A: val.val.intval = 0x3A;
            case 0x3B: val.val.intval = 0x3B;
            case 0x3C: val.val.intval = 0x3C;
            case 0x3D: val.val.intval = 0x3D;
            case 0x3E: val.val.intval = 0x3E;
            case 0x3F: val.val.intval = 0x3F;
            case 0x46: val.val.intval = 0x46;
            case 0x47: val.val.intval = 0x47;
            case 0x48: val.val.intval = 0x48;
            case 0x49: val.val.intval = 0x49;
            case 0x4A: val.val.intval = 0x4A;
            case 0x4B: val.val.intval = 0x4B;
            case 0x4C: val.val.intval = 0x4C;
            case 0x4D: val.val.intval = 0x4D;
            case 0x4E: val.val.intval = 0x4E;
            case 0x4F: val.val.intval = 0x4F;
            case 0x53: val.val.intval = 0x53;
            case 0x55: val.val.intval = 0x55;
            case 0x5A: val.val.intval = 0x5A;
            case 0x5B: val.val.intval = 0x5B;
            case 0x5C: val.val.intval = 0x5C;
            case 0x5D: val.val.intval = 0x5D;
            case 0x5E: val.val.intval = 0x5E;
            case 0x5F: val.val.intval = 0x5F;
            case 0x6E: val.val.intval = 0x6E;
            case 0x6F: val.val.intval = 0x6F;
            case 0x70: val.val.intval = 0x70;
            case 0x71: val.val.intval = 0x71;
            case 0x79: val.val.intval = 0x7D;
//            case 0xA2: val.val.intval = 0xA2;
//            case 0xA3: val.val.intval = 0xA3;
//            case 0xA4: val.val.intval = 0xA4;
//            case 0xA5: val.val.intval = 0xA5;
            case 0xA7: val.val.intval = 0xA7;
            case 0xA8: val.val.intval = 0xA8;
            case 0xA9: val.val.intval = 0xA9;
            case 0xBD: val.val.intval = 0xBD;
            case 0xBE: val.val.intval = 0xBE;
            case 0xBF: val.val.intval = 0xBF;
            case 0xC4: val.val.intval = 0xC4;
            case 0xC5: val.val.intval = 0xC5;
            case 0xC6: val.val.intval = 0xC6;
            case 0xC7: val.val.intval = 0xC7;
            case 0xC8: val.val.intval = 0xC8;
            case 0xC9: val.val.intval = 0xC9;
            case 0xCA: val.val.intval = 0xCA;
            case 0xCB: val.val.intval = 0xCB;
            case 0xCC: val.val.intval = 0xCC;
            case 0xCD: val.val.intval = 0xCD;
            case 0xCE: val.val.intval = 0xCE;
            case 0xCF: val.val.intval = 0xCF;
            case 0xDC: val.val.intval = 0xDC;
            case 0xDD: val.val.intval = 0xDD;
            case 0xDE: val.val.intval = 0xDE;
            case 0xDF: val.val.intval = 0xDF;
            case 0xF0: val.val.intval = 0xF0;
            case 0xF3: val.val.intval = 0xF3;
            case 0xF4: val.val.intval = 0xF4;
            case 0xF5: val.val.intval = 0xF5;
            case 0xF6: val.val.intval = 0xF6;
            case 0xF7: val.val.intval = 0xF7;
            case 0xF8: val.val.intval = 0xF8;
            case 0xF9: val.val.intval = 0xF9;
            case 0xFA: val.val.intval = 0xFA;
            case 0xFB: val.val.intval = 0xFB;
            case 0xFC: val.val.intval = 0xFC;
            case 0xFD: val.val.intval = 0xFD;
            case 0xFE: val.val.intval = 0xFE;
            case 0xFF: val.val.intval = 0xFF;
                err_throw(VMERR_INVALID_OPCODE);

            OS_IMPOSSIBLE_DEFAULT_CASE

#else /* OS_FILL_OUT_CASE_TABLES */
            case 0:
                /* 
                 *   Explicitly call out this invalid instruction case so
                 *   that we can avoid extra work in computing the switch.
                 *   Some compilers will be smart enough to observe that we
                 *   populate the full range of possible values (0-255) for
                 *   the datatype of the switch control expression, and thus
                 *   will build jump tables that can be jumped through
                 *   without range-checking the value.  (No range checking
                 *   is necessary, because a uchar simply cannot hold any
                 *   values outside of the 0-255 range.)  This doesn't
                 *   guarantee that the compiler will be smart, but it does
                 *   help with some compilers and shouldn't hurt performance
                 *   with those that don't make any use of the situation.  
                 */
                err_throw(VMERR_INVALID_OPCODE);
                
            case 0xFF:
                /* 
                 *   explicitly call out this invalid instruction for the
                 *   same reasons we call out case 0 above 
                 */
                err_throw(VMERR_INVALID_OPCODE);

            default:
                /* unrecognized opcode */
                err_throw(VMERR_INVALID_OPCODE);
                continue;

#endif /* OS_FILL_OUT_CASE_TABLES */
            }
        }

        /*
         *   We jump to this label when it's time to terminate execution
         *   and return to the host environment which called us. 
         */
    exit_loop:
        /* note that we're ready to return */
        done = TRUE;
    }